

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int analyzeAggregate(Walker *pWalker,Expr *pExpr)

{
  u8 enc_00;
  DbFixer *pDVar1;
  Parse *pPVar2;
  Parse *pPVar3;
  AggInfo *pInfo;
  char *pcVar4;
  Parse *pPVar5;
  anon_union_8_3_c79b3df9_for_y *paVar6;
  AggInfo_func *pAVar7;
  FuncDef *pFVar8;
  int iVar9;
  int local_ac;
  AggInfo_func *pAStack_88;
  u8 enc;
  AggInfo_func *pItem_1;
  Expr *pE;
  ExprList_item *pTerm;
  ExprList *pGB;
  int local_60;
  int n;
  int j;
  int k;
  AggInfo_col *pCol;
  SrcItem *pItem;
  AggInfo *pAggInfo;
  SrcList *pSrcList;
  Parse *pParse;
  NameContext *pNC;
  int i;
  Expr *pExpr_local;
  Walker *pWalker_local;
  
  pDVar1 = (pWalker->u).pFix;
  pPVar2 = pDVar1->pParse;
  pPVar3 = (pDVar1->w).pParse;
  pInfo = (AggInfo *)(pDVar1->w).xExprCallback;
  switch(pExpr->op) {
  case 0xa7:
  case 0xa9:
  case 0xb3:
    if (pPVar3 != (Parse *)0x0) {
      pNC._4_4_ = 0;
      pPVar5 = pPVar3;
LAB_0025c075:
      pCol = (AggInfo_col *)&pPVar5->zErrMsg;
      if (*(int *)&pPVar3->db <= pNC._4_4_) goto LAB_0025c2cf;
      if (pExpr->iTable != *(int *)&pCol[2].pTab) goto LAB_0025c2b3;
      _j = pInfo->aCol;
      n = 0;
      while ((n < pInfo->nColumn &&
             (((_j->iTable != pExpr->iTable || (_j->iColumn != pExpr->iColumn)) ||
              (pExpr->op == 0xb3))))) {
        n = n + 1;
        _j = _j + 1;
      }
      if ((pInfo->nColumn <= n) && (n = addAggInfoColumn(pPVar2->db,pInfo), -1 < n)) {
        paVar6 = (anon_union_8_3_c79b3df9_for_y *)(pInfo->aCol + n);
        *paVar6 = pExpr->y;
        paVar6[2].sub.iAddr = pExpr->iTable;
        *(ynVar *)(paVar6 + 3) = pExpr->iColumn;
        iVar9 = pPVar2->nMem + 1;
        pPVar2->nMem = iVar9;
        *(int *)((long)paVar6 + 0x14) = iVar9;
        *(i16 *)((long)paVar6 + 0x1a) = -1;
        paVar6[1].pTab = (Table *)pExpr;
        if ((pInfo->pGroupBy != (ExprList *)0x0) && (pExpr->op != 0xb3)) {
          pE = (Expr *)pInfo->pGroupBy->a;
          for (local_60 = 0; local_60 < pInfo->pGroupBy->nExpr; local_60 = local_60 + 1) {
            pcVar4 = *(char **)pE;
            if (((*pcVar4 == -0x59) && (*(int *)(pcVar4 + 0x2c) == pExpr->iTable)) &&
               (*(short *)(pcVar4 + 0x30) == pExpr->iColumn)) {
              *(i16 *)((long)paVar6 + 0x1a) = (i16)local_60;
              break;
            }
            pE = (Expr *)&pE->pRight;
          }
        }
        if (*(i16 *)((long)paVar6 + 0x1a) < 0) {
          iVar9 = pInfo->nSortingColumn;
          pInfo->nSortingColumn = iVar9 + 1;
          *(i16 *)((long)paVar6 + 0x1a) = (i16)iVar9;
        }
      }
      pExpr->pAggInfo = pInfo;
      if (pExpr->op == 0xa7) {
        pExpr->op = 0xa9;
      }
      pExpr->iAgg = (i16)n;
    }
LAB_0025c2cf:
    pWalker_local._4_4_ = 1;
    break;
  case 0xa8:
    if ((((pDVar1->w).walkerDepth & 0x20000U) == 0) && (pWalker->walkerDepth == (uint)pExpr->op2)) {
      pAStack_88 = pInfo->aFunc;
      pNC._4_4_ = 0;
      while (((pNC._4_4_ < pInfo->nFunc && (pAStack_88->pFExpr != pExpr)) &&
             (iVar9 = sqlite3ExprCompare((Parse *)0x0,pAStack_88->pFExpr,pExpr,-1), iVar9 != 0))) {
        pNC._4_4_ = pNC._4_4_ + 1;
        pAStack_88 = pAStack_88 + 1;
      }
      if (pInfo->nFunc <= pNC._4_4_) {
        enc_00 = pPVar2->db->enc;
        pNC._4_4_ = addAggInfoFunc(pPVar2->db,pInfo);
        if (-1 < pNC._4_4_) {
          pAVar7 = pInfo->aFunc + pNC._4_4_;
          pAVar7->pFExpr = pExpr;
          iVar9 = pPVar2->nMem + 1;
          pPVar2->nMem = iVar9;
          pAVar7->iMem = iVar9;
          if ((pExpr->x).pList == (ExprList *)0x0) {
            local_ac = 0;
          }
          else {
            local_ac = ((pExpr->x).pList)->nExpr;
          }
          pFVar8 = sqlite3FindFunction(pPVar2->db,(pExpr->u).zToken,local_ac,enc_00,'\0');
          pAVar7->pFunc = pFVar8;
          if ((pExpr->flags & 4) == 0) {
            pAVar7->iDistinct = -1;
          }
          else {
            iVar9 = pPVar2->nTab;
            pPVar2->nTab = iVar9 + 1;
            pAVar7->iDistinct = iVar9;
          }
        }
      }
      pExpr->iAgg = (i16)pNC._4_4_;
      pExpr->pAggInfo = pInfo;
      pWalker_local._4_4_ = 1;
    }
    else {
      pWalker_local._4_4_ = 0;
    }
    break;
  default:
    pWalker_local._4_4_ = 0;
  }
  return pWalker_local._4_4_;
LAB_0025c2b3:
  pNC._4_4_ = pNC._4_4_ + 1;
  pPVar5 = (Parse *)(pCol + 3);
  goto LAB_0025c075;
}

Assistant:

static int analyzeAggregate(Walker *pWalker, Expr *pExpr){
  int i;
  NameContext *pNC = pWalker->u.pNC;
  Parse *pParse = pNC->pParse;
  SrcList *pSrcList = pNC->pSrcList;
  AggInfo *pAggInfo = pNC->uNC.pAggInfo;

  assert( pNC->ncFlags & NC_UAggInfo );
  switch( pExpr->op ){
    case TK_IF_NULL_ROW:
    case TK_AGG_COLUMN:
    case TK_COLUMN: {
      testcase( pExpr->op==TK_AGG_COLUMN );
      testcase( pExpr->op==TK_COLUMN );
      testcase( pExpr->op==TK_IF_NULL_ROW );
      /* Check to see if the column is in one of the tables in the FROM
      ** clause of the aggregate query */
      if( ALWAYS(pSrcList!=0) ){
        SrcItem *pItem = pSrcList->a;
        for(i=0; i<pSrcList->nSrc; i++, pItem++){
          struct AggInfo_col *pCol;
          assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
          if( pExpr->iTable==pItem->iCursor ){
            /* If we reach this point, it means that pExpr refers to a table
            ** that is in the FROM clause of the aggregate query.
            **
            ** Make an entry for the column in pAggInfo->aCol[] if there
            ** is not an entry there already.
            */
            int k;
            pCol = pAggInfo->aCol;
            for(k=0; k<pAggInfo->nColumn; k++, pCol++){
              if( pCol->iTable==pExpr->iTable
               && pCol->iColumn==pExpr->iColumn
               && pExpr->op!=TK_IF_NULL_ROW
              ){
                break;
              }
            }
            if( (k>=pAggInfo->nColumn)
             && (k = addAggInfoColumn(pParse->db, pAggInfo))>=0
            ){
              pCol = &pAggInfo->aCol[k];
              assert( ExprUseYTab(pExpr) );
              pCol->pTab = pExpr->y.pTab;
              pCol->iTable = pExpr->iTable;
              pCol->iColumn = pExpr->iColumn;
              pCol->iMem = ++pParse->nMem;
              pCol->iSorterColumn = -1;
              pCol->pCExpr = pExpr;
              if( pAggInfo->pGroupBy && pExpr->op!=TK_IF_NULL_ROW ){
                int j, n;
                ExprList *pGB = pAggInfo->pGroupBy;
                struct ExprList_item *pTerm = pGB->a;
                n = pGB->nExpr;
                for(j=0; j<n; j++, pTerm++){
                  Expr *pE = pTerm->pExpr;
                  if( pE->op==TK_COLUMN
                   && pE->iTable==pExpr->iTable
                   && pE->iColumn==pExpr->iColumn
                  ){
                    pCol->iSorterColumn = j;
                    break;
                  }
                }
              }
              if( pCol->iSorterColumn<0 ){
                pCol->iSorterColumn = pAggInfo->nSortingColumn++;
              }
            }
            /* There is now an entry for pExpr in pAggInfo->aCol[] (either
            ** because it was there before or because we just created it).
            ** Convert the pExpr to be a TK_AGG_COLUMN referring to that
            ** pAggInfo->aCol[] entry.
            */
            ExprSetVVAProperty(pExpr, EP_NoReduce);
            pExpr->pAggInfo = pAggInfo;
            if( pExpr->op==TK_COLUMN ){
              pExpr->op = TK_AGG_COLUMN;
            }
            pExpr->iAgg = (i16)k;
            break;
          } /* endif pExpr->iTable==pItem->iCursor */
        } /* end loop over pSrcList */
      }
      return WRC_Prune;
    }
    case TK_AGG_FUNCTION: {
      if( (pNC->ncFlags & NC_InAggFunc)==0
       && pWalker->walkerDepth==pExpr->op2
      ){
        /* Check to see if pExpr is a duplicate of another aggregate
        ** function that is already in the pAggInfo structure
        */
        struct AggInfo_func *pItem = pAggInfo->aFunc;
        for(i=0; i<pAggInfo->nFunc; i++, pItem++){
          if( pItem->pFExpr==pExpr ) break;
          if( sqlite3ExprCompare(0, pItem->pFExpr, pExpr, -1)==0 ){
            break;
          }
        }
        if( i>=pAggInfo->nFunc ){
          /* pExpr is original.  Make a new entry in pAggInfo->aFunc[]
          */
          u8 enc = ENC(pParse->db);
          i = addAggInfoFunc(pParse->db, pAggInfo);
          if( i>=0 ){
            assert( !ExprHasProperty(pExpr, EP_xIsSelect) );
            pItem = &pAggInfo->aFunc[i];
            pItem->pFExpr = pExpr;
            pItem->iMem = ++pParse->nMem;
            assert( ExprUseUToken(pExpr) );
            pItem->pFunc = sqlite3FindFunction(pParse->db,
                   pExpr->u.zToken,
                   pExpr->x.pList ? pExpr->x.pList->nExpr : 0, enc, 0);
            if( pExpr->flags & EP_Distinct ){
              pItem->iDistinct = pParse->nTab++;
            }else{
              pItem->iDistinct = -1;
            }
          }
        }
        /* Make pExpr point to the appropriate pAggInfo->aFunc[] entry
        */
        assert( !ExprHasProperty(pExpr, EP_TokenOnly|EP_Reduced) );
        ExprSetVVAProperty(pExpr, EP_NoReduce);
        pExpr->iAgg = (i16)i;
        pExpr->pAggInfo = pAggInfo;
        return WRC_Prune;
      }else{
        return WRC_Continue;
      }
    }
  }
  return WRC_Continue;
}